

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O0

void ft_var_done_item_variation_store(TT_Face face,GX_ItemVarStore itemStore)

{
  FT_Memory memory_00;
  uint local_24;
  FT_UInt i;
  FT_Memory memory;
  GX_ItemVarStore itemStore_local;
  TT_Face face_local;
  
  memory_00 = (face->root).memory;
  if (itemStore->varData != (GX_ItemVarData)0x0) {
    for (local_24 = 0; local_24 < itemStore->dataCount; local_24 = local_24 + 1) {
      ft_mem_free(memory_00,itemStore->varData[local_24].regionIndices);
      itemStore->varData[local_24].regionIndices = (FT_UInt *)0x0;
      ft_mem_free(memory_00,itemStore->varData[local_24].deltaSet);
      itemStore->varData[local_24].deltaSet = (FT_Short *)0x0;
    }
    ft_mem_free(memory_00,itemStore->varData);
    itemStore->varData = (GX_ItemVarData)0x0;
  }
  if (itemStore->varRegionList != (GX_VarRegion)0x0) {
    for (local_24 = 0; local_24 < itemStore->regionCount; local_24 = local_24 + 1) {
      ft_mem_free(memory_00,itemStore->varRegionList[local_24].axisList);
      itemStore->varRegionList[local_24].axisList = (GX_AxisCoords)0x0;
    }
    ft_mem_free(memory_00,itemStore->varRegionList);
    itemStore->varRegionList = (GX_VarRegion)0x0;
  }
  return;
}

Assistant:

static void
  ft_var_done_item_variation_store( TT_Face          face,
                                    GX_ItemVarStore  itemStore )
  {
    FT_Memory  memory = FT_FACE_MEMORY( face );
    FT_UInt    i;


    if ( itemStore->varData )
    {
      for ( i = 0; i < itemStore->dataCount; i++ )
      {
        FT_FREE( itemStore->varData[i].regionIndices );
        FT_FREE( itemStore->varData[i].deltaSet );
      }

      FT_FREE( itemStore->varData );
    }

    if ( itemStore->varRegionList )
    {
      for ( i = 0; i < itemStore->regionCount; i++ )
        FT_FREE( itemStore->varRegionList[i].axisList );

      FT_FREE( itemStore->varRegionList );
    }
  }